

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testbits.cpp
# Opt level: O1

void testfiles(wins *wins_ar,int ar_len)

{
  int iVar1;
  Am_Drawonable *pAVar2;
  char cVar3;
  char *pcVar4;
  ulong uVar5;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  Am_Image_Array image_array;
  Am_Image_Array local_40 [8];
  Am_Style image_style;
  
  if (0 < ar_len) {
    uVar5 = 0;
    do {
      pAVar2 = wins_ar[uVar5].d1;
      iVar7 = 10;
      lVar8 = 0;
      do {
        pcVar4 = (char *)Am_Merge_Pathname((char *)((long)&_ZZ9testfilesP4winsiE9filenames_rel +
                                                   (long)*(int *)((long)&
                                                  _ZZ9testfilesP4winsiE9filenames_rel + lVar8)));
        Am_Image_Array::Am_Image_Array(&image_array,pcVar4);
        cVar3 = Am_Image_Array::Valid();
        if (cVar3 == '\0') {
          uVar6 = Am_Error("bitmap not found");
          Am_Style::~Am_Style(&image_style);
          Am_Image_Array::~Am_Image_Array(&image_array);
          _Unwind_Resume(uVar6);
        }
        iVar1 = *(int *)((long)&_ZZ9testfilesP4winsiE10colornames_rel + lVar8);
        Am_Image_Array::Am_Image_Array(local_40,&image_array);
        Am_Style::Am_Style(&image_style,(long)&_ZZ9testfilesP4winsiE10colornames_rel + (long)iVar1,8
                           ,1,0,1,&Am_DEFAULT_DASH_LIST,2,2,0,local_40);
        Am_Image_Array::~Am_Image_Array(local_40);
        (**(code **)(*(long *)pAVar2 + 0x160))(pAVar2,&Am_White,&image_style,iVar7,10,0x28,0x28,0);
        Am_Style::~Am_Style(&image_style);
        Am_Image_Array::~Am_Image_Array(&image_array);
        lVar8 = lVar8 + 4;
        iVar7 = iVar7 + 0x32;
      } while (lVar8 != 0x14);
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)ar_len);
  }
  return;
}

Assistant:

void
testfiles(wins *wins_ar, int ar_len)
{
  static const char *filenames[5] = {IMFN_GREY, IMFN_HI, IMFN_SMILE, IMFN_FUN,
                                     IMFN_DIAMOND};
  static const char *colornames[5] = {"purple", "green", "blue", "black",
                                      "red"};

  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *d = wins_ar[i].d1;
    for (int n = 0; n < 5; n++) {
      Am_Image_Array image_array(Am_Merge_Pathname(filenames[n]));
      if (!image_array.Valid())
        Am_Error("bitmap not found");
      Am_Style image_style(colornames[n], 8, Am_CAP_BUTT, Am_JOIN_MITER,
                           Am_LINE_ON_OFF_DASH, Am_DEFAULT_DASH_LIST,
                           Am_DEFAULT_DASH_LIST_LENGTH, Am_FILL_STIPPLED,
                           Am_FILL_POLY_EVEN_ODD, image_array);
      int left = 10 + 50 * n;
      d->Draw_Rectangle(Am_White, image_style, left, 10, 40, 40);
    }
  }
}